

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopCheck.c
# Opt level: O0

int Hop_ManCheck(Hop_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Hop_Obj_t *pHVar6;
  Hop_Obj_t *pHVar7;
  int local_2c;
  int i;
  Hop_Obj_t *pObj2;
  Hop_Obj_t *pObj;
  Hop_Man_t *p_local;
  
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vPis), local_2c < iVar1; local_2c = local_2c + 1) {
    pHVar6 = (Hop_Obj_t *)Vec_PtrEntry(p->vPis,local_2c);
    pHVar7 = Hop_ObjFanin0(pHVar6);
    if ((pHVar7 != (Hop_Obj_t *)0x0) || (pHVar7 = Hop_ObjFanin1(pHVar6), pHVar7 != (Hop_Obj_t *)0x0)
       ) {
      printf("Hop_ManCheck: The PI node \"%p\" has fanins.\n",pHVar6);
      return 0;
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vPos), local_2c < iVar1; local_2c = local_2c + 1) {
    pHVar6 = (Hop_Obj_t *)Vec_PtrEntry(p->vPos,local_2c);
    pHVar7 = Hop_ObjFanin0(pHVar6);
    if (pHVar7 == (Hop_Obj_t *)0x0) {
      printf("Hop_ManCheck: The PO node \"%p\" has NULL fanin.\n",pHVar6);
      return 0;
    }
    pHVar7 = Hop_ObjFanin1(pHVar6);
    if (pHVar7 != (Hop_Obj_t *)0x0) {
      printf("Hop_ManCheck: The PO node \"%p\" has second fanin.\n",pHVar6);
      return 0;
    }
  }
  local_2c = 0;
  do {
    if (p->nTableSize <= local_2c) {
      iVar1 = Hop_ManObjNum(p);
      iVar2 = Hop_ManPiNum(p);
      iVar3 = Hop_ManPoNum(p);
      iVar4 = Hop_ManAndNum(p);
      iVar5 = Hop_ManExorNum(p);
      if (iVar1 == iVar2 + 1 + iVar3 + iVar4 + iVar5) {
        iVar1 = Hop_TableCountEntries(p);
        iVar2 = Hop_ManAndNum(p);
        iVar3 = Hop_ManExorNum(p);
        if (iVar1 == iVar2 + iVar3) {
          p_local._4_4_ = 1;
        }
        else {
          printf("Hop_ManCheck: The number of nodes in the structural hashing table is wrong.\n");
          p_local._4_4_ = 0;
        }
      }
      else {
        printf("Hop_ManCheck: The number of created nodes is wrong.\n");
        p_local._4_4_ = 0;
      }
      return p_local._4_4_;
    }
    pHVar6 = p->pTable[local_2c];
    if (pHVar6 != (Hop_Obj_t *)0x0) {
      pHVar7 = Hop_ObjFanin0(pHVar6);
      if ((pHVar7 == (Hop_Obj_t *)0x0) ||
         (pHVar7 = Hop_ObjFanin1(pHVar6), pHVar7 == (Hop_Obj_t *)0x0)) {
        printf("Hop_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n",pHVar6);
        return 0;
      }
      pHVar7 = Hop_ObjFanin0(pHVar6);
      iVar1 = pHVar7->Id;
      pHVar7 = Hop_ObjFanin1(pHVar6);
      if (pHVar7->Id <= iVar1) {
        printf("Hop_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n",pHVar6);
        return 0;
      }
      pHVar7 = Hop_TableLookup(p,pHVar6);
      if (pHVar7 != pHVar6) {
        printf("Hop_ManCheck: Node \"%p\" is not in the structural hashing table.\n",pHVar6);
        return 0;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the consistency of the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Hop_ManCheck( Hop_Man_t * p )
{
    Hop_Obj_t * pObj, * pObj2;
    int i;
    // check primary inputs
    Hop_ManForEachPi( p, pObj, i )
    {
        if ( Hop_ObjFanin0(pObj) || Hop_ObjFanin1(pObj) )
        {
            printf( "Hop_ManCheck: The PI node \"%p\" has fanins.\n", pObj );
            return 0;
        }
    }
    // check primary outputs
    Hop_ManForEachPo( p, pObj, i )
    {
        if ( !Hop_ObjFanin0(pObj) )
        {
            printf( "Hop_ManCheck: The PO node \"%p\" has NULL fanin.\n", pObj );
            return 0;
        }
        if ( Hop_ObjFanin1(pObj) )
        {
            printf( "Hop_ManCheck: The PO node \"%p\" has second fanin.\n", pObj );
            return 0;
        }
    }
    // check internal nodes
    Hop_ManForEachNode( p, pObj, i )
    {
        if ( !Hop_ObjFanin0(pObj) || !Hop_ObjFanin1(pObj) )
        {
            printf( "Hop_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n", pObj );
            return 0;
        }
        if ( Hop_ObjFanin0(pObj)->Id >= Hop_ObjFanin1(pObj)->Id )
        {
            printf( "Hop_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n", pObj );
            return 0;
        }
        pObj2 = Hop_TableLookup( p, pObj );
        if ( pObj2 != pObj )
        {
            printf( "Hop_ManCheck: Node \"%p\" is not in the structural hashing table.\n", pObj );
            return 0;
        }
    }
    // count the total number of nodes
    if ( Hop_ManObjNum(p) != 1 + Hop_ManPiNum(p) + Hop_ManPoNum(p) + Hop_ManAndNum(p) + Hop_ManExorNum(p) )
    {
        printf( "Hop_ManCheck: The number of created nodes is wrong.\n" );
        return 0;
    }
    // count the number of nodes in the table
    if ( Hop_TableCountEntries(p) != Hop_ManAndNum(p) + Hop_ManExorNum(p) )
    {
        printf( "Hop_ManCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
//    if ( !Hop_ManIsAcyclic(p) )
//        return 0;
    return 1; 
}